

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int aec_decode_init(aec_stream_conflict *strm)

{
  uint uVar1;
  uint uVar2;
  internal_state_conflict *__s;
  code *pcVar3;
  _func_int_aec_stream_ptr_conflict **pp_Var4;
  uint32_t *puVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint32_t uVar13;
  
  uVar2 = strm->bits_per_sample;
  iVar7 = -1;
  if (0xffffffdf < uVar2 - 0x21) {
    __s = (internal_state_conflict *)malloc(0x358);
    if (__s != (internal_state_conflict *)0x0) {
      iVar12 = 0;
      memset(__s,0,0x358);
      iVar7 = 1;
      iVar8 = 0;
      do {
        lVar11 = 0;
        do {
          __s->se_table[(long)iVar12 * 2 + lVar11 * 2] = iVar8;
          __s->se_table[(long)iVar12 * 2 + lVar11 * 2 + 1] = iVar12;
          lVar11 = lVar11 + 1;
        } while (iVar7 != (int)lVar11);
        iVar12 = iVar12 + iVar7;
        iVar8 = iVar8 + 1;
        iVar7 = iVar7 + 1;
      } while (iVar8 != 0xd);
      strm->state = __s;
      if (uVar2 < 0x11) {
        if (uVar2 < 9) {
          if ((strm->flags & 0x10) == 0) {
            __s->id_len = 3;
          }
          else {
            if (4 < uVar2) {
              return -1;
            }
            if (uVar2 < 3) {
              __s->id_len = 1;
            }
            else {
              __s->id_len = 2;
            }
          }
          __s->bytes_per_sample = 1;
          __s->out_blklen = strm->block_size;
          pcVar3 = flush_8;
        }
        else {
          __s->bytes_per_sample = 2;
          __s->id_len = 4;
          __s->out_blklen = strm->block_size * 2;
          if ((strm->flags & 4) == 0) {
            pcVar3 = flush_lsb_16;
          }
          else {
            pcVar3 = flush_msb_16;
          }
        }
        __s->flush_output = pcVar3;
      }
      else {
        __s->id_len = 5;
        if ((uVar2 < 0x19) && (uVar10 = strm->flags, (uVar10 & 2) != 0)) {
          __s->bytes_per_sample = 3;
          if ((uVar10 & 4) == 0) {
            pcVar3 = flush_lsb_24;
          }
          else {
            pcVar3 = flush_msb_24;
          }
        }
        else {
          __s->bytes_per_sample = 4;
          if ((strm->flags & 4) == 0) {
            pcVar3 = flush_lsb_32;
          }
          else {
            pcVar3 = flush_msb_32;
          }
        }
        __s->flush_output = pcVar3;
        __s->out_blklen = __s->bytes_per_sample * strm->block_size;
      }
      uVar10 = strm->flags;
      if ((uVar10 & 1) == 0) {
        __s->xmin = 0;
        __s->xmax = ~(uint)(-1L << ((byte)uVar2 & 0x3f));
      }
      else {
        uVar1 = (uint)(-1L << ((byte)uVar2 - 1 & 0x3f));
        __s->xmax = ~uVar1;
        __s->xmin = uVar1;
      }
      uVar13 = strm->block_size;
      __s->in_blklen = (__s->id_len + uVar2 * uVar13 >> 3) + 0x10;
      bVar6 = (byte)__s->id_len;
      pp_Var4 = (_func_int_aec_stream_ptr_conflict **)
                malloc((0x100000000 << (bVar6 & 0x3f)) >> 0x1d);
      __s->id_table = pp_Var4;
      if (pp_Var4 != (_func_int_aec_stream_ptr_conflict **)0x0) {
        uVar9 = 1;
        *pp_Var4 = m_low_entropy;
        iVar7 = (int)(1L << (bVar6 & 0x3f));
        uVar2 = iVar7 - 1;
        if (2 < iVar7) {
          do {
            __s->id_table[uVar9] = m_split;
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
        __s->id_table[(int)uVar2] = m_uncomp;
        uVar9 = (ulong)(strm->rsi * uVar13);
        __s->rsi_size = uVar9;
        puVar5 = (uint32_t *)malloc(uVar9 << 2);
        __s->rsi_buffer = puVar5;
        if (puVar5 == (uint32_t *)0x0) {
          return -4;
        }
        uVar10 = uVar10 & 8;
        __s->pp = uVar10;
        if (uVar10 == 0) {
          __s->ref = 0;
        }
        else {
          __s->ref = 1;
          uVar13 = uVar13 - 1;
        }
        __s->encoded_block_size = uVar13;
        strm->total_in = 0;
        strm->total_out = 0;
        __s->rsip = puVar5;
        __s->flush_start = puVar5;
        __s->bitp = 0;
        __s->fs = 0;
        __s->mode = m_id;
        __s->offsets = (vector_t *)0x0;
        return 0;
      }
    }
    iVar7 = -4;
  }
  return iVar7;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    struct internal_state *state;
    int modi;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = (INT64_C(1) << (strm->bits_per_sample - 1)) - 1;
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = (UINT64_C(1) << strm->bits_per_sample) - 1;
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 16;

    modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (int i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;
    state->offsets = NULL;

    return AEC_OK;
}